

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

void Q_SetLen(QMatrix *Q,size_t RoC,size_t Len)

{
  LASErrIdType LVar1;
  ElType *local_30;
  ElType *PtrEl;
  size_t ElCount;
  size_t Len_local;
  size_t RoC_local;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((Q->Instance == Normal) && (RoC != 0)) && (RoC <= Q->Dim)) {
      Q->Len[RoC] = Len;
      if (Q->El[RoC] != (ElType *)0x0) {
        free(Q->El[RoC]);
      }
      if (Len == 0) {
        Q->El[RoC] = (ElType *)0x0;
      }
      else {
        local_30 = (ElType *)malloc(Len << 4);
        Q->El[RoC] = local_30;
        PtrEl = (ElType *)Len;
        if (local_30 == (ElType *)0x0) {
          LASError(LASMemAllocErr,"Q_SetLen",Q->Name,(char *)0x0,(char *)0x0);
        }
        else {
          for (; PtrEl != (ElType *)0x0; PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
            local_30->Pos = ZeroEl.Pos;
            local_30->Val = ZeroEl.Val;
            local_30 = local_30 + 1;
          }
        }
      }
    }
    else if (Q->Instance == Normal) {
      LASError(LASRangeErr,"Q_SetLen",Q->Name,(char *)0x0,(char *)0x0);
    }
    else {
      LASError(LASLValErr,"Q_SetLen",Q->Name,(char *)0x0,(char *)0x0);
    }
  }
  return;
}

Assistant:

void Q_SetLen(QMatrix *Q, size_t RoC, size_t Len)
/* set the lenght of a row or column of the matrix Q */
{
    size_t ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Q->Instance == Normal && RoC > 0 && RoC <= Q->Dim) {
            Q->Len[RoC] = Len;

            PtrEl = Q->El[RoC];

            if (PtrEl != NULL) {
                free(PtrEl);
		PtrEl = NULL;
	    }

            if (Len > 0) {
                PtrEl = (ElType *)malloc(Len * sizeof(ElType));
                Q->El[RoC] = PtrEl;

                if (PtrEl != NULL) {
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        *PtrEl = ZeroEl;
                        PtrEl++;
                    }
                } else {
                    LASError(LASMemAllocErr, "Q_SetLen", Q->Name, NULL, NULL);
                }
            } else {
                Q->El[RoC] = NULL;
            }
        } else {
            if (Q->Instance != Normal)
                LASError(LASLValErr, "Q_SetLen", Q->Name, NULL, NULL);
            else
                LASError(LASRangeErr, "Q_SetLen", Q->Name, NULL, NULL);
        }
    }
}